

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Multiband.cpp
# Opt level: O1

int Multiband::CreateCallback(UnityAudioEffectState *state)

{
  float *params;
  
  params = (float *)operator_new(0x1280);
  memset(params,0,0x1280);
  params[0x49e] = 5.73972e-42;
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,params);
  (state->field_0).field_0.effectdata = params;
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* effectdata = new EffectData;
        memset(effectdata, 0, sizeof(EffectData));
        effectdata->data.analyzer.spectrumSize = 4096;
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, effectdata->data.p);
        state->effectdata = effectdata;
        return UNITY_AUDIODSP_OK;
    }